

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWInstaller.cxx
# Opt level: O0

void __thiscall cmCPackIFWInstaller::GeneratePackageFiles(cmCPackIFWInstaller *this)

{
  bool bVar1;
  string *psVar2;
  reference ppVar3;
  cmCPackIFWPackage *package_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage_*>
  *p;
  iterator __end1;
  iterator __begin1;
  PackagesMap *__range1;
  string local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  undefined1 local_370 [8];
  string forcedOption;
  allocator<char> local_339;
  string local_338;
  cmValue local_318;
  cmValue option;
  cmCPackIFWPackage package;
  cmCPackIFWInstaller *this_local;
  
  package.Directory.field_2._8_8_ = this;
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage_*>_>_>
          ::empty(&this->Packages);
  if ((bVar1) ||
     (bVar1 = cmCPackIFWGenerator::IsOnePackage((this->super_cmCPackIFWCommon).Generator), bVar1)) {
    cmCPackIFWPackage::cmCPackIFWPackage((cmCPackIFWPackage *)&option);
    option.Value = (string *)(this->super_cmCPackIFWCommon).Generator;
    package.Checkable.field_2._8_8_ = this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_338,"CPACK_IFW_PACKAGE_GROUP",&local_339);
    local_318 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_338);
    std::__cxx11::string::~string((string *)&local_338);
    std::allocator<char>::~allocator(&local_339);
    bVar1 = cmValue::operator_cast_to_bool(&local_318);
    if (bVar1) {
      psVar2 = cmValue::operator_cast_to_string_(&local_318);
      cmCPackIFWPackage::ConfigureFromGroup((cmCPackIFWPackage *)&option,psVar2);
      psVar2 = cmValue::operator_cast_to_string_(&local_318);
      cmsys::SystemTools::UpperCase(&local_3b0,psVar2);
      std::operator+(&local_390,"CPACK_IFW_COMPONENT_GROUP_",&local_3b0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370,
                     &local_390,"_FORCED_INSTALLATION");
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::~string((string *)&local_3b0);
      __range1 = (PackagesMap *)
                 cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_370);
      bVar1 = cmValue::operator_cast_to_bool((cmValue *)&__range1);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        std::__cxx11::string::operator=((string *)(package.Virtual.field_2._M_local_buf + 8),"true")
        ;
      }
      std::__cxx11::string::~string((string *)local_370);
    }
    else {
      cmCPackIFWPackage::ConfigureFromOptions((cmCPackIFWPackage *)&option);
    }
    cmCPackIFWPackage::GeneratePackageFile((cmCPackIFWPackage *)&option);
    cmCPackIFWPackage::~cmCPackIFWPackage((cmCPackIFWPackage *)&option);
  }
  else {
    __end1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage_*>_>_>
             ::begin(&this->Packages);
    p = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage_*>
         *)std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage_*>_>_>
           ::end(&this->Packages);
    while (bVar1 = std::operator!=(&__end1,(_Self *)&p), bVar1) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage_*>_>
               ::operator*(&__end1);
      cmCPackIFWPackage::GeneratePackageFile(ppVar3->second);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage_*>_>
      ::operator++(&__end1);
    }
  }
  return;
}

Assistant:

void cmCPackIFWInstaller::GeneratePackageFiles()
{
  if (this->Packages.empty() || this->Generator->IsOnePackage()) {
    // Generate default package
    cmCPackIFWPackage package;
    package.Generator = this->Generator;
    package.Installer = this;
    // Check package group
    if (cmValue option = this->GetOption("CPACK_IFW_PACKAGE_GROUP")) {
      package.ConfigureFromGroup(option);
      std::string forcedOption = "CPACK_IFW_COMPONENT_GROUP_" +
        cmsys::SystemTools::UpperCase(option) + "_FORCED_INSTALLATION";
      if (!this->GetOption(forcedOption)) {
        package.ForcedInstallation = "true";
      }
    } else {
      package.ConfigureFromOptions();
    }
    package.GeneratePackageFile();
    return;
  }

  // Generate packages meta information
  for (auto& p : this->Packages) {
    cmCPackIFWPackage* package = p.second;
    package->GeneratePackageFile();
  }
}